

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int hinv(int *a,int nx,int ny,int smooth,int scale)

{
  uint uVar1;
  sbyte sVar2;
  int iVar3;
  int nytop_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *tmp_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  double dVar7;
  double dVar8;
  int *tmp;
  int s00;
  int s10;
  int hc;
  int hy;
  int hx;
  int h0;
  int lowbit1;
  int lowbit0;
  int nrnd2;
  int nrnd1;
  int nrnd0;
  int prnd2;
  int prnd1;
  int prnd0;
  int mask2;
  int mask1;
  int mask0;
  int bit2;
  int bit1;
  int bit0;
  int shift;
  int oddy;
  int oddx;
  int c;
  int nyf;
  int nxf;
  int nytop;
  int nxtop;
  int k;
  int j;
  int i;
  int log2n;
  int nmax;
  int local_104;
  uint local_100;
  int local_fc;
  uint local_f8;
  uint local_f4;
  int local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_d8;
  uint local_d0;
  int local_c8;
  int local_b4;
  int local_a4;
  int local_a0;
  uint local_80;
  uint local_7c;
  uint local_74;
  uint local_70;
  uint local_68;
  uint local_64;
  uint local_5c;
  uint local_58;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int n;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_4;
  
  local_b4 = in_EDX;
  if (in_EDX < in_ESI) {
    local_b4 = in_ESI;
  }
  dVar7 = log((double)local_b4);
  dVar8 = log(2.0);
  local_28 = (int)(dVar7 / dVar8 + 0.5);
  if (1 << ((byte)local_28 & 0x1f) < local_b4) {
    local_28 = local_28 + 1;
  }
  tmp_00 = (int *)malloc((long)((local_b4 + 1) / 2) << 2);
  if (tmp_00 == (int *)0x0) {
    ffpmsg((char *)0x25bffb);
    local_4 = 0x19e;
  }
  else {
    sVar2 = 1;
    local_58 = 1 << ((byte)local_28 - 1 & 0x1f);
    local_5c = local_58 << 1;
    local_64 = -local_58;
    local_68 = local_58 * -2;
    local_74 = (int)local_5c >> 1;
    iVar3 = (int)(local_58 << 2) >> 1;
    local_80 = local_74 - 1;
    local_c8 = iVar3 + -1;
    if (-1 < (int)*in_RDI) {
      local_c8 = iVar3;
    }
    *in_RDI = *in_RDI + local_c8 & local_58 * -4;
    local_38 = 1;
    n = 1;
    nytop_00 = 1 << ((byte)local_28 & 0x1f);
    iVar3 = in_EDX;
    local_70 = local_58;
    while( true ) {
      local_34 = local_28 + -1;
      local_70 = (int)local_70 >> 1;
      local_7c = local_70 - 1;
      if (local_34 < 0) break;
      nytop_00 = nytop_00 >> 1;
      local_38 = local_38 * 2;
      n = n * 2;
      if (nytop_00 < in_ESI) {
        in_ESI = in_ESI - nytop_00;
      }
      else {
        local_38 = local_38 + -1;
      }
      if (nytop_00 < iVar3) {
        iVar3 = iVar3 - nytop_00;
      }
      else {
        n = n + -1;
      }
      if (local_34 == 0) {
        local_7c = 0;
        sVar2 = 2;
      }
      for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
        unshuffle((int *)(in_RDI + in_EDX * local_2c),n,1,tmp_00);
      }
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        unshuffle((int *)(in_RDI + local_30),local_38,in_EDX,tmp_00);
      }
      if (in_ECX != 0) {
        hsmooth((int *)CONCAT44(n,in_ESI),iVar3,nytop_00,in_stack_ffffffffffffffb4,
                in_stack_ffffffffffffffb0);
      }
      in_stack_ffffffffffffffb4 = local_38 % 2;
      in_stack_ffffffffffffffb0 = n % 2;
      for (local_2c = 0; local_2c < local_38 - in_stack_ffffffffffffffb4; local_2c = local_2c + 2) {
        local_a4 = in_EDX * local_2c;
        local_a0 = local_a4 + in_EDX;
        for (local_30 = 0; local_30 < n - in_stack_ffffffffffffffb0; local_30 = local_30 + 2) {
          uVar6 = in_RDI[local_a4];
          if ((int)in_RDI[local_a0] < 0) {
            local_d0 = local_80;
          }
          else {
            local_d0 = local_74;
          }
          local_e4 = in_RDI[local_a0] + local_d0 & local_68;
          if ((int)in_RDI[local_a4 + 1] < 0) {
            local_d8 = local_80;
          }
          else {
            local_d8 = local_74;
          }
          local_e8 = in_RDI[local_a4 + 1] + local_d8 & local_68;
          if ((int)in_RDI[local_a0 + 1] < 0) {
            local_e0 = local_7c;
          }
          else {
            local_e0 = local_70;
          }
          uVar4 = in_RDI[local_a0 + 1] + local_e0 & local_64;
          uVar5 = uVar4 & local_58;
          uVar1 = uVar5;
          if (-1 < (int)local_e4) {
            uVar1 = -uVar5;
          }
          local_e4 = local_e4 + uVar1;
          uVar1 = uVar5;
          if (-1 < (int)local_e8) {
            uVar1 = -uVar5;
          }
          local_e8 = local_e8 + uVar1;
          local_f4 = (uVar4 ^ local_e4 ^ local_e8) & local_5c;
          if ((int)uVar6 < 0) {
            if (uVar5 != 0) {
              local_f4 = uVar5 - local_f4;
            }
            local_ec = uVar6 + local_f4;
          }
          else {
            local_ec = (uVar6 + uVar5) - local_f4;
          }
          in_RDI[local_a0 + 1] = (int)(local_ec + local_e4 + local_e8 + uVar4) >> sVar2;
          in_RDI[local_a0] = (int)(((local_ec + local_e4) - local_e8) - uVar4) >> sVar2;
          in_RDI[local_a4 + 1] = (int)(((local_ec - local_e4) + local_e8) - uVar4) >> sVar2;
          in_RDI[local_a4] = (int)(((local_ec - local_e4) - local_e8) + uVar4) >> sVar2;
          local_a4 = local_a4 + 2;
          local_a0 = local_a0 + 2;
        }
        if (in_stack_ffffffffffffffb0 != 0) {
          local_f8 = local_80;
          if (-1 < (int)in_RDI[local_a0]) {
            local_f8 = local_74;
          }
          local_f8 = in_RDI[local_a0] + local_f8;
          local_f8 = local_f8 & local_68;
          uVar6 = local_f8 & local_5c;
          if (-1 < (int)in_RDI[local_a4]) {
            uVar6 = -uVar6;
          }
          local_fc = in_RDI[local_a4] + uVar6;
          in_RDI[local_a0] = (int)(local_fc + local_f8) >> sVar2;
          in_RDI[local_a4] = (int)(local_fc - local_f8) >> sVar2;
        }
      }
      if (in_stack_ffffffffffffffb4 != 0) {
        local_a4 = in_EDX * local_2c;
        for (local_30 = 0; local_30 < n - in_stack_ffffffffffffffb0; local_30 = local_30 + 2) {
          local_100 = local_80;
          if (-1 < (int)in_RDI[local_a4 + 1]) {
            local_100 = local_74;
          }
          local_100 = in_RDI[local_a4 + 1] + local_100;
          local_100 = local_100 & local_68;
          uVar6 = local_100 & local_5c;
          if (-1 < (int)in_RDI[local_a4]) {
            uVar6 = -uVar6;
          }
          local_104 = in_RDI[local_a4] + uVar6;
          in_RDI[local_a4 + 1] = (int)(local_104 + local_100) >> sVar2;
          in_RDI[local_a4] = (int)(local_104 - local_100) >> sVar2;
          local_a4 = local_a4 + 2;
        }
        if (in_stack_ffffffffffffffb0 != 0) {
          in_RDI[local_a4] = (int)in_RDI[local_a4] >> sVar2;
        }
      }
      local_5c = local_58;
      local_58 = (int)local_58 >> 1;
      local_68 = local_64;
      local_64 = (int)local_64 >> 1;
      local_74 = local_70;
      local_80 = local_7c;
      local_28 = local_34;
    }
    free(tmp_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int 
hinv(int a[], int nx, int ny, int smooth ,int scale)
/*
int smooth;    0 for no smoothing, else smooth during inversion 
int scale;     used if smoothing is specified 
*/
{
int nmax, log2n, i, j, k;
int nxtop,nytop,nxf,nyf,c;
int oddx,oddy;
int shift, bit0, bit1, bit2, mask0, mask1, mask2,
	prnd0, prnd1, prnd2, nrnd0, nrnd1, nrnd2, lowbit0, lowbit1;
int h0, hx, hy, hc;
int s10, s00;
int *tmp;

	/*
	 * log2n is log2 of max(nx,ny) rounded up to next power of 2
	 */
	nmax = (nx>ny) ? nx : ny;
	log2n = (int) (log((float) nmax)/log(2.0)+0.5);
	if ( nmax > (1<<log2n) ) {
		log2n += 1;
	}
	/*
	 * get temporary storage for shuffling elements
	 */  
	tmp = (int *) malloc(((nmax+1)/2)*sizeof(int));
	if (tmp == (int *) NULL) {
		ffpmsg("hinv: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * set up masks, rounding parameters
	 */
	shift  = 1;
	bit0   = 1 << (log2n - 1);
	bit1   = bit0 << 1;
	bit2   = bit0 << 2;
	mask0  = -bit0;
	mask1  = mask0 << 1;
	mask2  = mask0 << 2;
	prnd0  = bit0 >> 1;
	prnd1  = bit1 >> 1;
	prnd2  = bit2 >> 1;
	nrnd0  = prnd0 - 1;
	nrnd1  = prnd1 - 1;
	nrnd2  = prnd2 - 1;
	/*
	 * round h0 to multiple of bit2
	 */
	a[0] = (a[0] + ((a[0] >= 0) ? prnd2 : nrnd2)) & mask2;
	/*
	 * do log2n expansions
	 *
	 * We're indexing a as a 2-D array with dimensions (nx,ny).
	 */
	nxtop = 1;
	nytop = 1;
	nxf = nx;
	nyf = ny;
	c = 1<<log2n;
	for (k = log2n-1; k>=0; k--) {
		/*
		 * this somewhat cryptic code generates the sequence
		 * ntop[k-1] = (ntop[k]+1)/2, where ntop[log2n] = n
		 */
		c = c>>1;
		nxtop = nxtop<<1;
		nytop = nytop<<1;
		if (nxf <= c) { nxtop -= 1; } else { nxf -= c; }
		if (nyf <= c) { nytop -= 1; } else { nyf -= c; }
		/*
		 * double shift and fix nrnd0 (because prnd0=0) on last pass
		 */
		if (k == 0) {
			nrnd0 = 0;
			shift = 2;
		}
		/*
		 * unshuffle in each dimension to interleave coefficients
		 */
		for (i = 0; i<nxtop; i++) {
			unshuffle(&a[ny*i],nytop,1,tmp);
		}
		for (j = 0; j<nytop; j++) {
			unshuffle(&a[j],nxtop,ny,tmp);
		}
		/*
		 * smooth by interpolating coefficients if SMOOTH != 0
		 */
		if (smooth) hsmooth(a,nxtop,nytop,ny,scale);
		oddx = nxtop % 2;
		oddy = nytop % 2;
		for (i = 0; i<nxtop-oddx; i += 2) {
			s00 = ny*i;				/* s00 is index of a[i,j]	*/
			s10 = s00+ny;			/* s10 is index of a[i+1,j]	*/
			for (j = 0; j<nytop-oddy; j += 2) {
				h0 = a[s00  ];
				hx = a[s10  ];
				hy = a[s00+1];
				hc = a[s10+1];
				/*
				 * round hx and hy to multiple of bit1, hc to multiple of bit0
				 * h0 is already a multiple of bit2
				 */
				hx = (hx + ((hx >= 0) ? prnd1 : nrnd1)) & mask1;
				hy = (hy + ((hy >= 0) ? prnd1 : nrnd1)) & mask1;
				hc = (hc + ((hc >= 0) ? prnd0 : nrnd0)) & mask0;
				/*
				 * propagate bit0 of hc to hx,hy
				 */
				lowbit0 = hc & bit0;
				hx = (hx >= 0) ? (hx - lowbit0) : (hx + lowbit0);
				hy = (hy >= 0) ? (hy - lowbit0) : (hy + lowbit0);
				/*
				 * Propagate bits 0 and 1 of hc,hx,hy to h0.
				 * This could be simplified if we assume h0>0, but then
				 * the inversion would not be lossless for images with
				 * negative pixels.
				 */
				lowbit1 = (hc ^ hx ^ hy) & bit1;
				h0 = (h0 >= 0)
					? (h0 + lowbit0 - lowbit1)
					: (h0 + ((lowbit0 == 0) ? lowbit1 : (lowbit0-lowbit1)));
				/*
				 * Divide sums by 2 (4 last time)
				 */
				a[s10+1] = (h0 + hx + hy + hc) >> shift;
				a[s10  ] = (h0 + hx - hy - hc) >> shift;
				a[s00+1] = (h0 - hx + hy - hc) >> shift;
				a[s00  ] = (h0 - hx - hy + hc) >> shift;
				s00 += 2;
				s10 += 2;
			}
			if (oddy) {
				/*
				 * do last element in row if row length is odd
				 * s00+1, s10+1 are off edge
				 */
				h0 = a[s00  ];
				hx = a[s10  ];
				hx = ((hx >= 0) ? (hx+prnd1) : (hx+nrnd1)) & mask1;
				lowbit1 = hx & bit1;
				h0 = (h0 >= 0) ? (h0 - lowbit1) : (h0 + lowbit1);
				a[s10  ] = (h0 + hx) >> shift;
				a[s00  ] = (h0 - hx) >> shift;
			}
		}
		if (oddx) {
			/*
			 * do last row if column length is odd
			 * s10, s10+1 are off edge
			 */
			s00 = ny*i;
			for (j = 0; j<nytop-oddy; j += 2) {
				h0 = a[s00  ];
				hy = a[s00+1];
				hy = ((hy >= 0) ? (hy+prnd1) : (hy+nrnd1)) & mask1;
				lowbit1 = hy & bit1;
				h0 = (h0 >= 0) ? (h0 - lowbit1) : (h0 + lowbit1);
				a[s00+1] = (h0 + hy) >> shift;
				a[s00  ] = (h0 - hy) >> shift;
				s00 += 2;
			}
			if (oddy) {
				/*
				 * do corner element if both row and column lengths are odd
				 * s00+1, s10, s10+1 are off edge
				 */
				h0 = a[s00  ];
				a[s00  ] = h0 >> shift;
			}
		}
		/*
		 * divide all the masks and rounding values by 2
		 */
		bit2 = bit1;
		bit1 = bit0;
		bit0 = bit0 >> 1;
		mask1 = mask0;
		mask0 = mask0 >> 1;
		prnd1 = prnd0;
		prnd0 = prnd0 >> 1;
		nrnd1 = nrnd0;
		nrnd0 = prnd0 - 1;
	}
	free(tmp);
	return(0);
}